

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitAtomicWait(InternalAnalyzer *this,AtomicWait *curr)

{
  AtomicWait *curr_local;
  InternalAnalyzer *this_local;
  
  this->parent->readsMemory = true;
  this->parent->writesMemory = true;
  this->parent->isAtomic = true;
  this->parent->implicitTrap = true;
  return;
}

Assistant:

void visitAtomicWait(AtomicWait* curr) {
      parent.readsMemory = true;
      // AtomicWait doesn't strictly write memory, but it does modify the
      // waiters list associated with the specified address, which we can think
      // of as a write.
      parent.writesMemory = true;
      parent.isAtomic = true;
      parent.implicitTrap = true;
    }